

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall
wasm::OptimizeInstructions::visitArrayNewFixed(OptimizeInstructions *this,ArrayNewFixed *curr)

{
  ExpressionList *this_00;
  size_t sVar1;
  Type this_01;
  bool bVar2;
  Expression **ppEVar3;
  Expression *pEVar4;
  HeapType HVar5;
  Const *pCVar6;
  ArrayNew *pAVar7;
  Block *this_02;
  uint uVar8;
  optional<wasm::Type> type_;
  undefined1 local_a0 [8];
  ChildLocalizer localizer;
  Type local_58;
  Type type;
  Builder local_48;
  Builder builder;
  
  if (((curr->super_SpecificExpression<(wasm::Expression::Id)73>).super_Expression.type.id != 1) &&
     (sVar1 = (curr->values).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements, sVar1 != 0)) {
    type.id = (uintptr_t)
              &(curr->super_SpecificExpression<(wasm::Expression::Id)73>).super_Expression.type;
    this_00 = &curr->values;
    uVar8 = 1;
    builder.wasm = (Module *)curr;
    do {
      this_01.id = type.id;
      if (sVar1 - 1 <= (ulong)(uVar8 - 1)) {
        local_48.wasm =
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
             ).
             super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .
             super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
             .currModule;
        localizer._40_8_ = wasm::Type::getHeapType((Type *)type.id);
        HeapType::getArray((HeapType *)local_a0);
        local_58.id = (uintptr_t)local_a0;
        bVar2 = wasm::Type::isDefaultable(&local_58);
        if (bVar2) {
          ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                              (&this_00->
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                               ,0);
          pEVar4 = getFallthrough(this,*ppEVar3);
          bVar2 = Properties::isSingleConstantExpression(pEVar4);
          if (bVar2) {
            Properties::getLiteral((Literal *)local_a0,pEVar4);
            Literal::makeZero((Literal *)&localizer.hasUnreachableChild,local_58);
            bVar2 = Literal::operator==((Literal *)local_a0,
                                        (Literal *)&localizer.hasUnreachableChild);
            Literal::~Literal((Literal *)&localizer.hasUnreachableChild);
            Literal::~Literal((Literal *)local_a0);
            if (bVar2) {
              HVar5 = wasm::Type::getHeapType(this_01.id);
              pCVar6 = Builder::makeConst<int>(&local_48,(int)sVar1);
              pAVar7 = Builder::makeArrayNew(&local_48,HVar5,(Expression *)pCVar6,(Expression *)0x0)
              ;
              pEVar4 = getDroppedChildrenAndAppend
                                 (this,(Expression *)builder.wasm,(Expression *)pAVar7);
              replaceCurrent(this,pEVar4);
              return;
            }
          }
        }
        if (sVar1 == 1) {
          return;
        }
        ChildLocalizer::ChildLocalizer
                  ((ChildLocalizer *)local_a0,(Expression *)builder.wasm,
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).
                   super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   .
                   super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   .currFunction,
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                   ).
                   super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   .
                   super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                   .currModule,
                   &((this->
                     super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                     ).super_Pass.runner)->options);
        this_02 = ChildLocalizer::getChildrenReplacement((ChildLocalizer *)local_a0);
        HVar5 = wasm::Type::getHeapType(this_01.id);
        pCVar6 = Builder::makeConst<int>(&local_48,(int)sVar1);
        ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this_00->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,0);
        pAVar7 = Builder::makeArrayNew(&local_48,HVar5,(Expression *)pCVar6,*ppEVar3);
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                  (&(this_02->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                   (Expression *)pAVar7);
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)pAVar7;
        Block::finalize(this_02,type_,Unknown);
        replaceCurrent(this,(Expression *)this_02);
        std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                  ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                   &localizer.wasm);
        return;
      }
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this_00->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)(uVar8 - 1));
      pEVar4 = *ppEVar3;
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this_00->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,(ulong)uVar8);
      bVar2 = areConsecutiveInputsEqual(this,pEVar4,*ppEVar3);
      uVar8 = uVar8 + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void visitArrayNewFixed(ArrayNewFixed* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }

    auto size = curr->values.size();
    if (size == 0) {
      // TODO: Consider what to do in the trivial case of an empty array: we can
      //       can use ArrayNew or ArrayNewFixed there. Measure which is best.
      return;
    }

    // If all the values are equal then we can optimize, either to
    // array.new_default (if they are all equal to the default) or array.new (if
    // they are all equal to some other value). First, see if they are all
    // equal, which we do by comparing in pairs: [0,1], then [1,2], etc.
    for (Index i = 0; i < size - 1; i++) {
      if (!areConsecutiveInputsEqual(curr->values[i], curr->values[i + 1])) {
        return;
      }
    }

    // Great, they are all equal!

    Builder builder(*getModule());

    // See if they are equal to a constant, and if that constant is the default.
    auto type = curr->type.getHeapType().getArray().element.type;
    if (type.isDefaultable()) {
      auto* value = getFallthrough(curr->values[0]);

      if (Properties::isSingleConstantExpression(value) &&
          Properties::getLiteral(value) == Literal::makeZero(type)) {
        // They are all equal to the default. Drop the children and return an
        // array.new_with_default.
        auto* withDefault = builder.makeArrayNew(
          curr->type.getHeapType(), builder.makeConst(int32_t(size)));
        replaceCurrent(getDroppedChildrenAndAppend(curr, withDefault));
        return;
      }
    }

    // They are all equal to each other, but not to the default value. If there
    // are 2 or more elements here then we can save by using array.new. For
    // example, with 2 elements we are doing this:
    //
    //  (array.new_fixed
    //    (A)
    //    (A)
    //  )
    // =>
    //  (array.new
    //    (A)
    //    (i32.const 2) ;; get two copies of (A)
    //  )
    //
    // However, with 1, ArrayNewFixed is actually more compact, and we optimize
    // ArrayNew to it, above.
    if (size == 1) {
      return;
    }

    // Move children to locals, if we need to keep them around. We are removing
    // them all, except from the first, when we remove the array.new_fixed's
    // list of children and replace it with a single child + a constant for the
    // number of children.
    ChildLocalizer localizer(
      curr, getFunction(), *getModule(), getPassOptions());
    auto* block = localizer.getChildrenReplacement();
    auto* arrayNew = builder.makeArrayNew(curr->type.getHeapType(),
                                          builder.makeConst(int32_t(size)),
                                          curr->values[0]);
    block->list.push_back(arrayNew);
    block->finalize();
    replaceCurrent(block);
  }